

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

time_point32 libtorrent::aux::from_time_t(time_t t)

{
  long lVar1;
  long lVar2;
  
  if (t != 0) {
    lVar1 = ::std::chrono::_V2::system_clock::now();
    lVar2 = ::std::chrono::_V2::system_clock::now();
    return (time_point32)SUB84((lVar2 + (t * 1000000000 - lVar1) + 500000000) / 1000000000,0);
  }
  return (duration)0;
}

Assistant:

time_point32 from_time_t(const std::time_t t)
	{
		// special case for unset value
		if (t == 0) return time_point32(seconds32(0));

		const auto tp = system_clock::from_time_t(t);
		const auto sys_now = system_clock::now();
		const auto lt_now = clock_type::now();

		auto r = lt_now + std::chrono::duration_cast<clock_type::duration>(tp - sys_now);
		// the conversion to seconds will truncate, make sure we round
		return std::chrono::time_point_cast<seconds32>(r + milliseconds(500));
	}